

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InetAddress.cpp
# Opt level: O0

InetAddress * __thiscall sznet::net::InetAddress::toIp_abi_cxx11_(InetAddress *this)

{
  sockaddr *addr;
  InetAddress *in_RSI;
  allocator local_59;
  undefined1 auStack_58 [8];
  char buf [64];
  InetAddress *this_local;
  
  _auStack_58 = vmovdqu64_avx512f(ZEXT1664((undefined1  [16])0x0));
  addr = getSockAddr(in_RSI);
  sockets::sz_toip(auStack_58,0x40,addr);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)this,auStack_58,&local_59);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  return this;
}

Assistant:

string InetAddress::toIp() const
{
	char buf[64] = "";
	sockets::sz_toip(buf, sizeof(buf), getSockAddr());
	return buf;
}